

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.c
# Opt level: O1

IXML_Element * ixmlDocument_getElementById(IXML_Document *doc,char *tagName)

{
  unsigned_short uVar1;
  int iVar2;
  char *__s2;
  IXML_Node *doc_00;
  IXML_Element *pIVar3;
  IXML_Element *pIVar4;
  
  pIVar4 = (IXML_Element *)0x0;
  while (((pIVar3 = pIVar4, (IXML_Element *)doc != (IXML_Element *)0x0 && (tagName != (char *)0x0))
         && ((uVar1 = ixmlNode_getNodeType(&doc->n), uVar1 != 1 ||
             ((__s2 = ixmlNode_getNodeName(&doc->n), __s2 != (char *)0x0 &&
              (iVar2 = strcmp(tagName,__s2), pIVar3 = (IXML_Element *)doc, iVar2 != 0))))))) {
    doc_00 = ixmlNode_getFirstChild(&doc->n);
    pIVar3 = ixmlDocument_getElementById((IXML_Document *)doc_00,tagName);
    if (pIVar3 != (IXML_Element *)0x0) {
      return pIVar3;
    }
    doc = (IXML_Document *)ixmlNode_getNextSibling(&doc->n);
  }
  return pIVar3;
}

Assistant:

IXML_Element *ixmlDocument_getElementById(
	IXML_Document *doc, const DOMString tagName)
{
	IXML_Element *rtElement = NULL;
	IXML_Node *nodeptr = (IXML_Node *)doc;
	const char *name;

	if (nodeptr == NULL || tagName == NULL) {
		return rtElement;
	}

	if (ixmlNode_getNodeType(nodeptr) == eELEMENT_NODE) {
		name = ixmlNode_getNodeName(nodeptr);
		if (name == NULL) {
			return rtElement;
		}

		if (strcmp(tagName, name) == 0) {
			rtElement = (IXML_Element *)nodeptr;
			return rtElement;
		} else {
			rtElement = ixmlDocument_getElementById(
				(IXML_Document *)ixmlNode_getFirstChild(
					nodeptr),
				tagName);
			if (rtElement == NULL) {
				rtElement = ixmlDocument_getElementById(
					(IXML_Document *)
						ixmlNode_getNextSibling(
							nodeptr),
					tagName);
			}
		}
	} else {
		rtElement = ixmlDocument_getElementById(
			(IXML_Document *)ixmlNode_getFirstChild(nodeptr),
			tagName);
		if (rtElement == NULL) {
			rtElement = ixmlDocument_getElementById(
				(IXML_Document *)ixmlNode_getNextSibling(
					nodeptr),
				tagName);
		}
	}

	return rtElement;
}